

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

PARTITION_TYPE
read_partition(MACROBLOCKD *xd,int mi_row,int mi_col,aom_reader *r,int has_rows,int has_cols,
              BLOCK_SIZE bsize)

{
  int iVar1;
  aom_cdf_prob *in_RCX;
  int in_EDX;
  int in_ESI;
  MACROBLOCKD *in_RDI;
  int in_R8D;
  int in_R9D;
  BLOCK_SIZE in_stack_00000008;
  aom_cdf_prob cdf_1 [2];
  aom_cdf_prob cdf [2];
  aom_cdf_prob *partition_cdf;
  FRAME_CONTEXT *ec_ctx;
  int ctx;
  aom_cdf_prob *in_stack_ffffffffffffffa8;
  aom_reader *in_stack_ffffffffffffffb0;
  aom_reader *r_00;
  PARTITION_TYPE local_1;
  
  iVar1 = partition_plane_context(in_RDI,in_ESI,in_EDX,in_stack_00000008);
  if ((in_R8D == 0) && (in_R9D == 0)) {
    local_1 = '\x03';
  }
  else {
    r_00 = (aom_reader *)(in_RDI->tile_ctx->partition_cdf + iVar1);
    if ((in_R8D == 0) || (in_R9D == 0)) {
      if ((in_R8D == 0) && (in_R9D != 0)) {
        partition_gather_vert_alike
                  ((aom_cdf_prob *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,BLOCK_4X4);
        iVar1 = aom_read_cdf_(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0);
        local_1 = '\x01';
        if (iVar1 != 0) {
          local_1 = '\x03';
        }
      }
      else {
        partition_gather_horz_alike
                  ((aom_cdf_prob *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,BLOCK_4X4);
        iVar1 = aom_read_cdf_(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0);
        local_1 = '\x02';
        if (iVar1 != 0) {
          local_1 = '\x03';
        }
      }
    }
    else {
      partition_cdf_length(in_stack_00000008);
      iVar1 = aom_read_symbol_(r_00,in_RCX,0);
      local_1 = (PARTITION_TYPE)iVar1;
    }
  }
  return local_1;
}

Assistant:

static PARTITION_TYPE read_partition(MACROBLOCKD *xd, int mi_row, int mi_col,
                                     aom_reader *r, int has_rows, int has_cols,
                                     BLOCK_SIZE bsize) {
  const int ctx = partition_plane_context(xd, mi_row, mi_col, bsize);
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;

  if (!has_rows && !has_cols) return PARTITION_SPLIT;

  assert(ctx >= 0);
  aom_cdf_prob *partition_cdf = ec_ctx->partition_cdf[ctx];
  if (has_rows && has_cols) {
    return (PARTITION_TYPE)aom_read_symbol(
        r, partition_cdf, partition_cdf_length(bsize), ACCT_STR);
  } else if (!has_rows && has_cols) {
    assert(bsize > BLOCK_8X8);
    aom_cdf_prob cdf[2];
    partition_gather_vert_alike(cdf, partition_cdf, bsize);
    assert(cdf[1] == AOM_ICDF(CDF_PROB_TOP));
    return aom_read_cdf(r, cdf, 2, ACCT_STR) ? PARTITION_SPLIT : PARTITION_HORZ;
  } else {
    assert(has_rows && !has_cols);
    assert(bsize > BLOCK_8X8);
    aom_cdf_prob cdf[2];
    partition_gather_horz_alike(cdf, partition_cdf, bsize);
    assert(cdf[1] == AOM_ICDF(CDF_PROB_TOP));
    return aom_read_cdf(r, cdf, 2, ACCT_STR) ? PARTITION_SPLIT : PARTITION_VERT;
  }
}